

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

int __thiscall QTableView::sizeHintForRow(QTableView *this,int row)

{
  QPersistentModelIndex *this_00;
  long lVar1;
  QTableViewPrivate *this_01;
  QWidgetData *pQVar2;
  bool bVar3;
  int iVar4;
  int visualIndex;
  int iVar5;
  int logicalIndex;
  QAbstractItemModel *pQVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  int local_170;
  int local_16c;
  QModelIndex local_158;
  QModelIndex local_140;
  QModelIndex local_128;
  QStyleOptionViewItem option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar6 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar6 == (QAbstractItemModel *)0x0) {
    local_170 = -1;
  }
  else {
    QWidget::ensurePolished((QWidget *)this);
    iVar4 = QHeaderView::resizeContentsPrecision(this_01->verticalHeader);
    visualIndex = QHeaderView::visualIndexAt(this_01->horizontalHeader,0);
    if (visualIndex < 1) {
      visualIndex = 0;
    }
    pQVar2 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_16c = QHeaderView::visualIndexAt
                          (this_01->horizontalHeader,
                           ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1);
    if (local_16c == -1) {
      pQVar6 = (this_01->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&option,&(this_01->super_QAbstractItemViewPrivate).root);
      local_16c = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&option);
      local_16c = local_16c + -1;
    }
    iVar7 = 0;
    memset(&option,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&option);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&option);
    local_128.r = -1;
    local_128.c = -1;
    local_128.i = 0;
    local_128.m.ptr = (QAbstractItemModel *)0x0;
    this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
    local_170 = 0;
    for (iVar8 = visualIndex; iVar5 = iVar7, iVar8 <= local_16c; iVar8 = iVar8 + 1) {
      iVar5 = QHeaderView::logicalIndex(this_01->horizontalHeader,iVar8);
      bVar3 = QHeaderView::isSectionHidden(this_01->horizontalHeader,iVar5);
      if (!bVar3) {
        pQVar6 = (this_01->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_158,this_00);
        (**(code **)(*(long *)pQVar6 + 0x60))(&local_140,pQVar6,row,iVar5,&local_158);
        local_128.m.ptr = local_140.m.ptr;
        local_128.r = local_140.r;
        local_128.c = local_140.c;
        local_128.i = local_140.i;
        local_170 = QTableViewPrivate::heightHintForIndex(this_01,&local_128,local_170,&option);
        iVar7 = iVar7 + 1;
        iVar5 = iVar4;
        if (iVar7 == iVar4) break;
      }
    }
    pQVar6 = (this_01->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_140,this_00);
    iVar7 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&local_140);
    iVar8 = iVar8 + -1;
    if (iVar7 <= visualIndex) {
      iVar5 = iVar4;
    }
    if (iVar4 == 0) {
      iVar5 = iVar4;
    }
    iVar7 = iVar7 + -1;
    while ((iVar5 != iVar4 && ((0 < visualIndex || (iVar8 < iVar7))))) {
      if ((((byte)iVar5 & 0 < visualIndex) == 0) && (iVar8 != iVar7)) {
        do {
          if (iVar7 <= iVar8) goto LAB_0052dc00;
          iVar8 = iVar8 + 1;
          logicalIndex = QHeaderView::logicalIndex(this_01->horizontalHeader,iVar8);
          bVar3 = QHeaderView::isSectionHidden(this_01->horizontalHeader,logicalIndex);
        } while (bVar3);
      }
      else {
        do {
          if (visualIndex < 1) goto LAB_0052dc00;
          visualIndex = visualIndex + -1;
          logicalIndex = QHeaderView::logicalIndex(this_01->horizontalHeader,visualIndex);
          bVar3 = QHeaderView::isSectionHidden(this_01->horizontalHeader,logicalIndex);
        } while (bVar3);
      }
      if (-1 < logicalIndex) {
        pQVar6 = (this_01->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_158,this_00);
        (**(code **)(*(long *)pQVar6 + 0x60))(&local_140,pQVar6,row,logicalIndex,&local_158);
        local_128.m.ptr = local_140.m.ptr;
        local_128.r = local_140.r;
        local_128.c = local_140.c;
        local_128.i = local_140.i;
        local_170 = QTableViewPrivate::heightHintForIndex(this_01,&local_128,local_170,&option);
      }
LAB_0052dc00:
      iVar5 = iVar5 + 1;
    }
    local_170 = local_170 + (uint)this_01->showGrid;
    QStyleOptionViewItem::~QStyleOptionViewItem(&option);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_170;
}

Assistant:

int QTableView::sizeHintForRow(int row) const
{
    Q_D(const QTableView);

    if (!model())
        return -1;

    ensurePolished();
    const int maximumProcessCols = d->verticalHeader->resizeContentsPrecision();


    int left = qMax(0, d->horizontalHeader->visualIndexAt(0));
    int right = d->horizontalHeader->visualIndexAt(d->viewport->width());
    if (right == -1) // the table don't have enough columns to fill the viewport
        right = d->model->columnCount(d->root) - 1;

    QStyleOptionViewItem option;
    initViewItemOption(&option);

    int hint = 0;
    QModelIndex index;
    int columnsProcessed = 0;
    int column = left;
    for (; column <= right; ++column) {
        int logicalColumn = d->horizontalHeader->logicalIndex(column);
        if (d->horizontalHeader->isSectionHidden(logicalColumn))
            continue;
        index = d->model->index(row, logicalColumn, d->root);
        hint = d->heightHintForIndex(index, hint, option);

        ++columnsProcessed;
        if (columnsProcessed == maximumProcessCols)
            break;
    }

    const int actualRight = d->model->columnCount(d->root) - 1;
    int idxLeft = left;
    int idxRight = column - 1;

    if (maximumProcessCols == 0 || actualRight < idxLeft)
        columnsProcessed = maximumProcessCols; // skip the while loop

    while (columnsProcessed != maximumProcessCols && (idxLeft > 0 || idxRight < actualRight)) {
        int logicalIdx  = -1;

        if ((columnsProcessed % 2 && idxLeft > 0) || idxRight == actualRight) {
            while (idxLeft > 0) {
                --idxLeft;
                int logcol = d->horizontalHeader->logicalIndex(idxLeft);
                if (d->horizontalHeader->isSectionHidden(logcol))
                    continue;
                logicalIdx = logcol;
                break;
            }
        } else {
            while (idxRight < actualRight) {
                ++idxRight;
                int logcol = d->horizontalHeader->logicalIndex(idxRight);
                if (d->horizontalHeader->isSectionHidden(logcol))
                    continue;
                logicalIdx = logcol;
                break;
            }
        }
        if (logicalIdx >= 0) {
            index = d->model->index(row, logicalIdx, d->root);
            hint = d->heightHintForIndex(index, hint, option);
        }
        ++columnsProcessed;
    }

    return d->showGrid ? hint + 1 : hint;
}